

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O0

void __thiscall
cuckoocache_tests::EraseParallelTest::
test_cache_erase_parallel<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (EraseParallelTest *this,size_t megabytes)

{
  uint256 e;
  uint256 e_00;
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  reference pvVar4;
  vector<uint256,_std::allocator<uint256>_> *this_00;
  long in_RSI;
  cache<uint256,_SignatureCacheHasher> *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  pair<unsigned_int,_unsigned_long> pVar6;
  double hit_rate_stale;
  double hit_rate_erased_but_contained;
  uint32_t i_5;
  uint32_t i_4;
  uint32_t i_3;
  size_t count_fresh;
  size_t count_stale;
  size_t count_erased_but_contained;
  uint32_t i_2;
  thread *t;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  uint32_t x;
  uint32_t i_1;
  uint8_t j;
  uint32_t *ptr;
  uint32_t i;
  size_t bytes;
  double load;
  double hit_rate_fresh;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  uint32_t n_insert;
  vector<uint256,_std::allocator<uint256>_> hashes;
  unique_lock<std::shared_mutex> l;
  unique_lock<std::shared_mutex> l_1;
  shared_mutex mtx;
  cache<uint256,_SignatureCacheHasher> set;
  char *in_stack_fffffffffffffc78;
  lazy_ostream *in_stack_fffffffffffffc80;
  assertion_result *in_stack_fffffffffffffc88;
  type *in_stack_fffffffffffffc90;
  BasicTestingSetup *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  lazy_ostream *in_stack_fffffffffffffca8;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffcb0;
  const_string *file;
  const_string *this_01;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffffcc8;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  long local_2f0;
  uint local_2d4;
  uint local_2bc;
  uint local_2b8;
  byte local_2b1;
  uint32_t *local_2b0;
  uint local_2a4;
  undefined8 in_stack_fffffffffffffd80;
  undefined4 uVar7;
  undefined4 uVar8;
  cache<uint256,_SignatureCacheHasher> *pcVar9;
  lazy_ostream local_240 [2];
  assertion_result local_220 [2];
  lazy_ostream local_1e8;
  undefined1 local_1d0 [64];
  double local_190;
  thread *local_188;
  thread *local_180;
  uint local_178;
  undefined1 *local_170;
  uint *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  uint local_11c;
  undefined1 local_118 [56];
  undefined1 local_e0 [56];
  undefined1 local_a8 [96];
  cache<uint256,_SignatureCacheHasher> *local_48;
  lazy_ostream *plStack_40;
  assertion_result *local_38;
  undefined8 uStack_30;
  cache<uint256,_SignatureCacheHasher> *local_28;
  lazy_ostream *plStack_20;
  assertion_result *local_18;
  type *ptStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = 0;
  uVar8 = 0x3ff00000;
  pcVar9 = in_RDI;
  BasicTestingSetup::SeedRandomForTest
            (in_stack_fffffffffffffc98,(SeedRand)((ulong)in_stack_fffffffffffffc90 >> 0x20));
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc78);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache
            ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffc98);
  uVar3 = in_RSI << 0x14;
  pVar6 = CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes
                    ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffc98,
                     (size_t)in_stack_fffffffffffffc90);
  this_00 = (vector<uint256,_std::allocator<uint256>_> *)pVar6.second;
  local_11c = (uint)(long)((double)CONCAT44(uVar8,uVar7) * (double)(uVar3 >> 5));
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc98,
             (size_type)in_stack_fffffffffffffc90);
  for (local_2a4 = 0; local_2a4 < local_11c; local_2a4 = local_2a4 + 1) {
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc88,
               (size_type)in_stack_fffffffffffffc80);
    local_2b0 = (uint32_t *)base_blob<256U>::begin((base_blob<256U> *)in_stack_fffffffffffffc78);
    for (local_2b1 = 0; local_2b1 < 8; local_2b1 = local_2b1 + 1) {
      uVar2 = RandomMixin<FastRandomContext>::rand32
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffc78);
      *local_2b0 = uVar2;
      local_2b0 = local_2b0 + 1;
    }
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector(this_00,in_stack_fffffffffffffcc8);
  std::shared_mutex::shared_mutex((shared_mutex *)in_stack_fffffffffffffc78);
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffc88,
             (mutex_type *)in_stack_fffffffffffffc80);
  for (local_2b8 = 0; local_2b8 < local_11c >> 1; local_2b8 = local_2b8 + 1) {
    pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc88,
                        (size_type)in_stack_fffffffffffffc80);
    in_stack_fffffffffffffc78 = *(char **)(pvVar4->super_base_blob<256U>).m_data._M_elems;
    in_stack_fffffffffffffc80 =
         *(lazy_ostream **)((pvVar4->super_base_blob<256U>).m_data._M_elems + 8);
    in_stack_fffffffffffffc88 =
         *(assertion_result **)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
    in_stack_fffffffffffffc90 = *(type **)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
    e.super_base_blob<256U>.m_data._M_elems[8] = (char)uVar7;
    e.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)uVar7 >> 8);
    e.super_base_blob<256U>.m_data._M_elems[10] = (char)((uint)uVar7 >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((uint)uVar7 >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffffd80;
    e.super_base_blob<256U>.m_data._M_elems[1] = (char)((ulong)in_stack_fffffffffffffd80 >> 8);
    e.super_base_blob<256U>.m_data._M_elems[2] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[3] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems[4] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    e.super_base_blob<256U>.m_data._M_elems[5] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x28);
    e.super_base_blob<256U>.m_data._M_elems[6] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x30);
    e.super_base_blob<256U>.m_data._M_elems[7] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x38);
    e.super_base_blob<256U>.m_data._M_elems[0xc] = (char)uVar8;
    e.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((uint)uVar8 >> 8);
    e.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((uint)uVar8 >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((uint)uVar8 >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_RSI;
    e.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)in_RSI >> 8);
    e.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)in_RSI >> 0x10);
    e.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)in_RSI >> 0x18);
    e.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)in_RSI >> 0x20);
    e.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)in_RSI >> 0x28);
    e.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)in_RSI >> 0x30);
    e.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)in_RSI >> 0x38);
    e.super_base_blob<256U>.m_data._M_elems._24_8_ = pcVar9;
    local_28 = (cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffc78;
    plStack_20 = in_stack_fffffffffffffc80;
    local_18 = in_stack_fffffffffffffc88;
    ptStack_10 = in_stack_fffffffffffffc90;
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(in_RDI,e);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock
            ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffc78);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc78);
  for (local_2bc = 0; local_2bc < 3; local_2bc = local_2bc + 1) {
    local_178 = local_2bc;
    local_170 = local_e0;
    local_168 = &local_11c;
    local_160 = local_a8;
    local_158 = local_118;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<cuckoocache_tests::EraseParallelTest::test_cache_erase_parallel<CuckooCache::cache<uint256,SignatureCacheHasher>>(unsigned_long)::_lambda()_1_>
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc98,
               in_stack_fffffffffffffc90);
  }
  local_180 = (thread *)
              std::vector<std::thread,_std::allocator<std::thread>_>::begin
                        ((vector<std::thread,_std::allocator<std::thread>_> *)
                         in_stack_fffffffffffffc80);
  local_188 = (thread *)
              std::vector<std::thread,_std::allocator<std::thread>_>::end
                        ((vector<std::thread,_std::allocator<std::thread>_> *)
                         in_stack_fffffffffffffc80);
  while (bVar1 = __gnu_cxx::
                 operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                           ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             *)in_stack_fffffffffffffc88,
                            (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             *)in_stack_fffffffffffffc80), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
               *)in_stack_fffffffffffffc78);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                *)in_stack_fffffffffffffc78);
  }
  std::unique_lock<std::shared_mutex>::unique_lock
            ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffc88,
             (mutex_type *)in_stack_fffffffffffffc80);
  for (local_2d4 = local_11c >> 1; local_2d4 < local_11c; local_2d4 = local_2d4 + 1) {
    pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc88,
                        (size_type)in_stack_fffffffffffffc80);
    in_stack_fffffffffffffc78 = *(char **)(pvVar4->super_base_blob<256U>).m_data._M_elems;
    in_stack_fffffffffffffc80 =
         *(lazy_ostream **)((pvVar4->super_base_blob<256U>).m_data._M_elems + 8);
    in_stack_fffffffffffffc88 =
         *(assertion_result **)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_30 = *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
    e_00.super_base_blob<256U>.m_data._M_elems[8] = (char)uVar7;
    e_00.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)uVar7 >> 8);
    e_00.super_base_blob<256U>.m_data._M_elems[10] = (char)((uint)uVar7 >> 0x10);
    e_00.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((uint)uVar7 >> 0x18);
    e_00.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffffd80;
    e_00.super_base_blob<256U>.m_data._M_elems[1] = (char)((ulong)in_stack_fffffffffffffd80 >> 8);
    e_00.super_base_blob<256U>.m_data._M_elems[2] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x10)
    ;
    e_00.super_base_blob<256U>.m_data._M_elems[3] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x18)
    ;
    e_00.super_base_blob<256U>.m_data._M_elems[4] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x20)
    ;
    e_00.super_base_blob<256U>.m_data._M_elems[5] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x28)
    ;
    e_00.super_base_blob<256U>.m_data._M_elems[6] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x30)
    ;
    e_00.super_base_blob<256U>.m_data._M_elems[7] = (char)((ulong)in_stack_fffffffffffffd80 >> 0x38)
    ;
    e_00.super_base_blob<256U>.m_data._M_elems[0xc] = (char)uVar8;
    e_00.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((uint)uVar8 >> 8);
    e_00.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((uint)uVar8 >> 0x10);
    e_00.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((uint)uVar8 >> 0x18);
    e_00.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_RSI;
    e_00.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((ulong)in_RSI >> 8);
    e_00.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((ulong)in_RSI >> 0x10);
    e_00.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((ulong)in_RSI >> 0x18);
    e_00.super_base_blob<256U>.m_data._M_elems[0x14] = (char)((ulong)in_RSI >> 0x20);
    e_00.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((ulong)in_RSI >> 0x28);
    e_00.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((ulong)in_RSI >> 0x30);
    e_00.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((ulong)in_RSI >> 0x38);
    e_00.super_base_blob<256U>.m_data._M_elems._24_8_ = pcVar9;
    local_48 = (cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffc78;
    plStack_40 = in_stack_fffffffffffffc80;
    local_38 = in_stack_fffffffffffffc88;
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(in_RDI,e_00);
  }
  local_2f0 = 0;
  for (local_2f4 = 0; local_2f4 < local_11c >> 2; local_2f4 = local_2f4 + 1) {
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc88,
               (size_type)in_stack_fffffffffffffc80);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
              (in_stack_fffffffffffffcb0,(uint256 *)in_stack_fffffffffffffca8,
               (bool)in_stack_fffffffffffffca7);
  }
  for (local_2f8 = local_11c >> 2; local_2f8 < local_11c >> 1; local_2f8 = local_2f8 + 1) {
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc88,
               (size_type)in_stack_fffffffffffffc80);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
              (in_stack_fffffffffffffcb0,(uint256 *)in_stack_fffffffffffffca8,
               (bool)in_stack_fffffffffffffca7);
  }
  for (local_2fc = local_11c >> 1; local_2fc < local_11c; local_2fc = local_2fc + 1) {
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc88,
               (size_type)in_stack_fffffffffffffc80);
    bVar1 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                      (in_stack_fffffffffffffcb0,(uint256 *)in_stack_fffffffffffffca8,
                       (bool)in_stack_fffffffffffffca7);
    local_2f0 = (ulong)bVar1 + local_2f0;
  }
  auVar5._8_4_ = (int)((ulong)local_2f0 >> 0x20);
  auVar5._0_8_ = local_2f0;
  auVar5._12_4_ = 0x45300000;
  local_190 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_2f0) - 4503599627370496.0)) /
              ((double)local_11c / 2.0);
  do {
    this_01 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,(const_string *)in_stack_fffffffffffffcb0,
               (size_t)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc80,(char (*) [1])in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    local_1e8._vptr_lazy_ostream = (_func_int **)0x3ff0000000000000;
    in_stack_fffffffffffffc88 = (assertion_result *)0x1e75e55;
    in_stack_fffffffffffffc80 = &local_1e8;
    in_stack_fffffffffffffc78 = "hit_rate_fresh";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
              (local_1d0,&local_1e8.m_empty,0x10f,1,2,&local_190);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc78);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_01,file,(size_t)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffc88,SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
    in_stack_fffffffffffffca8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffc80,(basic_cstring<const_char> *)in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc78 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_220,local_240,(const_string *)&stack0xfffffffffffffda0,0x112,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffc78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc78);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_lock<std::shared_mutex>::~unique_lock
            ((unique_lock<std::shared_mutex> *)in_stack_fffffffffffffc78);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffc88);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc88);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache
            ((cache<uint256,_SignatureCacheHasher> *)in_stack_fffffffffffffc78);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffc88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void test_cache_erase_parallel(size_t megabytes)
{
    double load = 1;
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;
    std::shared_mutex mtx;

    {
        /** Grab lock to make sure we release inserts */
        std::unique_lock<std::shared_mutex> l(mtx);
        /** Insert the first half */
        for (uint32_t i = 0; i < (n_insert / 2); ++i)
            set.insert(hashes_insert_copy[i]);
    }

    /** Spin up 3 threads to run contains with erase.
     */
    std::vector<std::thread> threads;
    /** Erase the first quarter */
    for (uint32_t x = 0; x < 3; ++x)
        /** Each thread is emplaced with x copy-by-value
        */
        threads.emplace_back([&, x] {
            std::shared_lock<std::shared_mutex> l(mtx);
            size_t ntodo = (n_insert/4)/3;
            size_t start = ntodo*x;
            size_t end = ntodo*(x+1);
            for (uint32_t i = start; i < end; ++i) {
                bool contains = set.contains(hashes[i], true);
                assert(contains);
            }
        });

    /** Wait for all threads to finish
     */
    for (std::thread& t : threads)
        t.join();
    /** Grab lock to make sure we observe erases */
    std::unique_lock<std::shared_mutex> l(mtx);
    /** Insert the second half */
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        set.insert(hashes_insert_copy[i]);

    /** elements that we marked erased but that are still there */
    size_t count_erased_but_contained = 0;
    /** elements that we did not erase but are older */
    size_t count_stale = 0;
    /** elements that were most recently inserted */
    size_t count_fresh = 0;

    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        count_erased_but_contained += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 4); i < (n_insert / 2); ++i)
        count_stale += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        count_fresh += set.contains(hashes[i], false);

    double hit_rate_erased_but_contained = double(count_erased_but_contained) / (double(n_insert) / 4.0);
    double hit_rate_stale = double(count_stale) / (double(n_insert) / 4.0);
    double hit_rate_fresh = double(count_fresh) / (double(n_insert) / 2.0);

    // Check that our hit_rate_fresh is perfect
    BOOST_CHECK_EQUAL(hit_rate_fresh, 1.0);
    // Check that we have a more than 2x better hit rate on stale elements than
    // erased elements.
    BOOST_CHECK(hit_rate_stale > 2 * hit_rate_erased_but_contained);
}